

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  _Function_base *p_Var2;
  undefined1 uVar3;
  undefined2 minLen;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *plVar4;
  string most_common_only;
  __native_type *p_Var5;
  ulong *puVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Argument *pAVar10;
  reference pvVar11;
  int *piVar12;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this;
  reference_wrapper<std::mutex_*> rVar13;
  void *__dest;
  ostream *poVar14;
  size_t sVar15;
  _Elt_pointer pfVar16;
  _List_node_base *p_Var17;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  size_t __n;
  undefined1 auVar20 [8];
  reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar21;
  ulong uVar22;
  ulong *puVar23;
  char *pcVar24;
  long *in_FS_OFFSET;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  json config;
  int codewordLen;
  string inp;
  string configPath;
  BitInStream bin;
  unordered_map<string,_vector<string>_> motif;
  unsigned_short ret;
  int ret_2;
  unordered_set<string> codewords;
  ofstream out;
  unordered_map<string,_int32_t> freqDict;
  ofstream confout;
  FreqTable freqs;
  ArgumentParser program;
  ProbMap propMap;
  unordered_map<string,_char2double> pMap;
  stringstream buffer;
  undefined1 local_1050 [24];
  undefined1 local_1038 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  any local_ff8;
  any local_fe8;
  undefined1 local_fd8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_fd0;
  undefined1 local_fc8 [48];
  pointer local_f98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f78;
  string local_f68;
  string local_f48;
  string local_f28;
  long *local_f08 [2];
  long local_ef8 [2];
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_e68;
  _Any_data local_e50;
  code *local_e40;
  _Any_data local_e30;
  code *local_e20;
  unordered_map<string,_vector<string>_> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  undefined1 local_d88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d78;
  int aiStack_d68 [8];
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d48;
  pointer local_cd0;
  pointer local_cc8;
  undefined1 local_b20 [16];
  string local_b10;
  _Head_base<2UL,_std::reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_af0;
  _Head_base<1UL,_std::reference_wrapper<FreqTable>,_false> local_ae8;
  _Head_base<0UL,_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_ae0;
  unordered_set<std::string> local_918;
  undefined1 local_8e0 [8];
  reference_wrapper<std::mutex_*> local_8d8;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *local_8d0 [2];
  _Head_base<4UL,_std::reference_wrapper<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_false>
  local_8c0;
  _Head_base<3UL,_std::reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_8b8;
  _Head_base<2UL,_std::reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_8b0;
  _Head_base<1UL,_std::reference_wrapper<FreqTable>,_false> local_8a8;
  _Head_base<0UL,_std::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_8a0;
  ios_base local_7e8 [264];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  string2int32 local_6c0;
  undefined1 local_688 [8];
  __native_type *local_680;
  __native_type local_678 [2];
  ios_base local_608 [120];
  ios_base local_590 [264];
  FreqTable local_488;
  ArgumentParser local_370;
  ProbMap local_288;
  unordered_map<string,_char2double> local_200;
  unordered_map<string,_char2double> local_1b8;
  ios_base local_138 [264];
  
  res_lock = (mutex *)operator_new(0x28);
  (res_lock->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(res_lock->super___mutex_base)._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(res_lock->super___mutex_base)._M_mutex + 0x10) = 0;
  (res_lock->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (res_lock->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_ec8._M_dataplus._M_p = (pointer)&local_ec8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec8,"arithmetic_error_correction","");
  local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee8,"1.0.0","");
  sVar15 = 3;
  argparse::ArgumentParser::ArgumentParser(&local_370,&local_ec8,&local_ee8,all);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
    operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ec8._M_dataplus._M_p != &local_ec8.field_2) {
    operator_delete(local_ec8._M_dataplus._M_p,local_ec8.field_2._M_allocated_capacity + 1);
  }
  pAVar10 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                      (&local_370,"-e","--encode");
  local_d88._0_8_ = local_d88._0_8_ & 0xffffffffffffff00;
  pAVar10 = argparse::Argument::default_value<bool>(pAVar10,(bool *)local_d88);
  local_fe8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_fe8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar10->mImplicitValue,&local_fe8);
  pAVar10->mNumArgs = 0;
  local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da8,"encode a file","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar10->mHelp,&local_da8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
    operator_delete(local_da8._M_dataplus._M_p,local_da8.field_2._M_allocated_capacity + 1);
  }
  if ((mz_file_read_func)local_fe8._M_manager != (mz_file_read_func)0x0) {
    (*local_fe8._M_manager)((void *)0x3,(mz_uint64)&local_fe8,(void *)0x0,sVar15);
    local_fe8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar10 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                      (&local_370,"-d","--decode");
  local_d88._0_8_ = local_d88._0_8_ & 0xffffffffffffff00;
  pAVar10 = argparse::Argument::default_value<bool>(pAVar10,(bool *)local_d88);
  local_ff8._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_ff8._M_storage = (_Storage)0x1;
  std::any::operator=(&pAVar10->mImplicitValue,&local_ff8);
  pAVar10->mNumArgs = 0;
  local_dc8._M_dataplus._M_p = (pointer)&local_dc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc8,"decode a file","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pAVar10->mHelp,&local_dc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8._M_dataplus._M_p != &local_dc8.field_2) {
    operator_delete(local_dc8._M_dataplus._M_p,local_dc8.field_2._M_allocated_capacity + 1);
  }
  if ((mz_realloc_func)local_ff8._M_manager != (mz_realloc_func)0x0) {
    (*local_ff8._M_manager)((void *)0x3,&local_ff8,0,sVar15);
    local_ff8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  pAVar10 = argparse::ArgumentParser::add_argument<char_const*>(&local_370,"Config");
  pAVar10->field_0xcc = pAVar10->field_0xcc | 2;
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,"config file with program parameters","");
  main_cold_1();
  argparse::ArgumentParser::parse_args(&local_370,argc,argv);
  aArgumentName._M_str = "--encode";
  aArgumentName._M_len = 8;
  bVar7 = argparse::ArgumentParser::get<bool>(&local_370,aArgumentName);
  aArgumentName_00._M_str = "--decode";
  aArgumentName_00._M_len = 8;
  bVar8 = argparse::ArgumentParser::get<bool>(&local_370,aArgumentName_00);
  if ((bVar7 == bVar8) ||
     (aArgumentName_01._M_str = "-h", aArgumentName_01._M_len = 2,
     bVar8 = argparse::ArgumentParser::get<bool>(&local_370,aArgumentName_01), bVar8)) {
    poVar14 = argparse::operator<<((ostream *)&std::cerr,&local_370);
    std::endl<char,std::char_traits<char>>(poVar14);
    exit(1);
  }
  aArgumentName_02._M_str = "Config";
  aArgumentName_02._M_len = 6;
  argparse::ArgumentParser::get<std::__cxx11::string>(&local_1018,&local_370,aArgumentName_02);
  local_f08[0] = local_ef8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f08,local_1018._M_dataplus._M_p,
             local_1018._M_dataplus._M_p + local_1018._M_string_length);
  parseValidateConfig((string *)local_1050,SUB81(local_f08,0));
  if (local_f08[0] != local_ef8) {
    operator_delete(local_f08[0],local_ef8[0] + 1);
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_1050,"general");
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar11,"codebook");
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar11,"words");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_d88,pvVar11);
  parseFasta(&local_918,(string *)local_d88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._0_8_ != &local_d78) {
    operator_delete((void *)local_d88._0_8_,local_d78._M_allocated_capacity + 1);
  }
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)local_1050,"general");
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar11,"codebook");
  pvVar11 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)pvVar11,"motifs");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_d88,pvVar11);
  readConcScheme(&local_e10,(string *)local_d88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._0_8_ != &local_d78) {
    operator_delete((void *)local_d88._0_8_,local_d78._M_allocated_capacity + 1);
  }
  local_1050._20_4_ = getCodewordLen(&local_918);
  ProbMap::ProbMap(&local_288,local_1050._20_4_,false,&local_918,&local_e10);
  ProbMap::freqDict_abi_cxx11_(&local_6c0,&local_288);
  ProbMap::createTransitionDict(&local_200,&local_288,&local_6c0);
  local_d78._M_allocated_capacity = 0;
  local_d88._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_d88;
  local_d88._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_d88;
  std::__cxx11::
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::_M_move_assign(&results_abi_cxx11_,
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_d88);
  std::__cxx11::
  _List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::_M_clear((_List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_d88);
  local_f28._M_dataplus._M_p = (pointer)&local_f28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f28,"");
  FreqTable::FreqTable(&local_488,&local_e10,&local_f28,0,false,local_1050._20_4_,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_dataplus._M_p != &local_f28.field_2) {
    operator_delete(local_f28._M_dataplus._M_p,local_f28.field_2._M_allocated_capacity + 1);
  }
  FreqTable::calcFreqs(&local_488);
  if (bVar7) {
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_1050,"encode");
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar11,"input");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_d88,pvVar11);
    local_b20._0_8_ = local_d88._8_8_;
    local_b20._8_8_ = local_d88._0_8_;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_b20,".zip");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d88._0_8_ != &local_d78) {
      operator_delete((void *)local_d88._0_8_,local_d78._M_allocated_capacity + 1);
    }
    if (bVar7) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_f78,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_1050);
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"min_length");
      local_d88._0_8_ = local_d88._0_8_ & 0xffffffffffff0000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
                (pvVar11,(unsigned_short *)local_d88);
      minLen = local_d88._0_2_;
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"same_length");
      local_d88._0_8_ = local_d88._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar11,(boolean_t *)local_d88);
      uVar3 = local_d88[0];
      local_f48._M_dataplus._M_p = (pointer)&local_f48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f48,local_1018._M_dataplus._M_p,
                 local_1018._M_dataplus._M_p + local_1018._M_string_length);
      encode_zip(&local_f78,&local_488,minLen,(bool)uVar3,&local_f48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f48._M_dataplus._M_p != &local_f48.field_2) {
        operator_delete(local_f48._M_dataplus._M_p,local_f48.field_2._M_allocated_capacity + 1);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_f78);
    }
    else {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"input");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_b20,pvVar11);
      std::ifstream::ifstream(local_d88,(string *)local_b20,_S_bin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_b10) {
        operator_delete((void *)local_b20._0_8_,(ulong)((long)local_b10._M_dataplus._M_p + 1));
      }
      if (*(int *)((long)aiStack_d68 + *(size_type *)(local_d88._0_8_ - 0x18)) != 0) {
        __assert_fail("inStream.good()",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/main.cpp"
                      ,0xac,"int main(int, char **)");
      }
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"sync");
      local_b20._0_8_ = local_b20._0_8_ & 0xffffffff00000000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar11,(int *)local_b20);
      BitInStream::BitInStream((BitInStream *)local_fd8,(istream *)local_d88,local_b20._0_4_);
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"output");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_b20,pvVar11);
      std::ofstream::ofstream(local_8e0,(string *)local_b20,_S_bin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_b10) {
        operator_delete((void *)local_b20._0_8_,(ulong)((long)local_b10._M_dataplus._M_p + 1));
      }
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"min_length");
      local_b20._0_8_ = local_b20._0_8_ & 0xffffffff00000000;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar11,(int *)local_b20);
      inflating<std::ofstream>
                (&local_488,(BitInStream *)local_fd8,
                 (basic_ofstream<char,_std::char_traits<char>_> *)local_8e0,local_b20._0_4_);
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"encode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"update_config");
      local_b20._0_8_ = local_b20._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar11,(boolean_t *)local_b20);
      if (local_b20[0] == (string)0x1) {
        std::ostream::flush();
        std::ofstream::close();
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"encode");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"output");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_688,pvVar11);
        std::ifstream::ifstream(local_b20,(string *)local_688,_S_in);
        if (local_688 != (undefined1  [8])local_678) {
          operator_delete((void *)local_688,(ulong)(local_678[0].__align + 1));
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::ostream::operator<<(&local_1b8.mHashMultiplier,(streambuf *)&local_b10);
        std::__cxx11::stringbuf::str();
        local_f88.m_type = null;
        local_f88.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)5>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_f88,(long)(int)local_1038._8_4_);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_f88,true);
        local_688 = (undefined1  [8])local_678;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"/decode/length","");
        nlohmann::
        json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::split(&local_e68.reference_tokens,(string *)local_688);
        this = nlohmann::
               json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::get_unchecked(&local_e68,
                               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_1050);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(this,&local_f88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e68.reference_tokens);
        if (local_688 != (undefined1  [8])local_678) {
          operator_delete((void *)local_688,(ulong)(local_678[0].__align + 1));
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_f88);
        std::ofstream::ofstream(local_688,(string *)&local_1018,_S_out);
        nlohmann::operator<<
                  ((ostream *)local_688,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_1050);
        local_688 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_688 + *(long *)&_VTT[-1].__data.__kind) = _strtod;
        std::filebuf::~filebuf((filebuf *)&local_680);
        std::ios_base::~ios_base(local_590);
        if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_138);
        std::ifstream::~ifstream(local_b20);
      }
      local_8e0 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_8e0 + *(long *)&_VTT[-1].__data.__kind) = _strtod;
      std::filebuf::~filebuf((filebuf *)&local_8d8);
      std::ios_base::~ios_base(local_7e8);
      if ((void *)local_fc8._32_8_ != (void *)0x0) {
        operator_delete((void *)local_fc8._32_8_,(long)local_f98 - local_fc8._32_8_);
      }
      if ((pointer)local_fc8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_fc8._8_8_,local_fc8._24_8_ - local_fc8._8_8_);
      }
      std::ifstream::~ifstream(local_d88);
    }
  }
  else {
    ProbMap::ProbMap((ProbMap *)local_d88,local_1050._20_4_,true,&local_918,&local_e10);
    ProbMap::createTransitionDict(&local_1b8,(ProbMap *)local_d88,&local_6c0);
    robin_hood::detail::
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Table(&local_d48);
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_d88 + 8));
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)local_1050,"decode");
    pvVar11 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar11,"input");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_d88,pvVar11);
    local_b20._0_8_ = local_d88._8_8_;
    local_b20._8_8_ = local_d88._0_8_;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_b20,".zip");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d88._0_8_ != &local_d78) {
      operator_delete((void *)local_d88._0_8_,local_d78._M_allocated_capacity + 1);
    }
    if (bVar7) {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"decode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"input");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (local_b20,pvVar11);
      Zippy::ZipArchive::ZipArchive((ZipArchive *)local_d88,(string *)local_b20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b20._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_b10) {
        operator_delete((void *)local_b20._0_8_,(ulong)((long)local_b10._M_dataplus._M_p + 1));
      }
      Zippy::ZipArchive::GetEntryNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_688,(ZipArchive *)local_d88,true,true);
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"threads");
      local_8e0 = (undefined1  [8])((ulong)(uint)local_8e0._4_4_ << 0x20);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar11,(int *)local_8e0);
      absl::synchronization_internal::ThreadPool::ThreadPool
                ((ThreadPool *)local_b20,local_8e0._0_4_);
      p_Var5 = local_680;
      local_fd8 = (undefined1  [8])0x0;
      pbStack_fd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_fc8._0_8_ = (mz_zip_internal_state *)0x0;
      if (local_688 != (undefined1  [8])local_680) {
        auVar20 = local_688;
        do {
          Zippy::ZipArchive::GetEntry((ZipArchive *)local_1038,(string *)local_d88);
          Zippy::Impl::ZipEntry::GetDataAsString_abi_cxx11_
                    ((string *)local_8e0,(ZipEntry *)CONCAT44(local_1038._12_4_,local_1038._8_4_));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_fd8,
                     (string *)local_8e0);
          if (local_8e0 != (undefined1  [8])local_8d0) {
            operator_delete((void *)local_8e0,(ulong)((long)local_8d0[0] + 1));
          }
          auVar20 = (undefined1  [8])((long)auVar20 + 0x20);
        } while (auVar20 != (undefined1  [8])p_Var5);
      }
      pbVar19 = pbStack_fd0;
      if (local_fd8 != (undefined1  [8])pbStack_fd0) {
        auVar20 = local_fd8;
        rVar21._M_data =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fd8;
        do {
          local_8e0 = (undefined1  [8])do_decode;
          local_8d8._M_data = &res_lock;
          local_8d0[0] = &results_abi_cxx11_;
          local_8d0[1] = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)(local_1050 + 0x14);
          local_8c0._M_head_impl._M_data =
               (reference_wrapper<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                )local_1050;
          local_8b8._M_head_impl._M_data =
               (reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )&local_e10;
          local_8b0._M_head_impl._M_data =
               (reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )&local_1b8;
          local_8a8._M_head_impl._M_data = (reference_wrapper<FreqTable>)&local_488;
          local_8a0._M_head_impl._M_data =
               (reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )rVar21._M_data;
          std::function<void()>::
          function<std::_Bind<void(*(std::reference_wrapper<std::__cxx11::string>,std::reference_wrapper<FreqTable>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::reference_wrapper<int>,std::reference_wrapper<std::__cxx11::list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tupl___td::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,std::mutex*)>,void>
                    ((function<void()> *)local_e30._M_pod_data,(_Bind<_19e92c60_> *)local_8e0);
          absl::synchronization_internal::ThreadPool::Schedule
                    ((ThreadPool *)local_b20,(function<void_()> *)&local_e30);
          if (local_e20 != (code *)0x0) {
            (*local_e20)(&local_e30,&local_e30,__destroy_functor);
          }
          auVar20 = (undefined1  [8])((long)auVar20 + 0x20);
          rVar21._M_data = rVar21._M_data + 1;
        } while (auVar20 != (undefined1  [8])pbVar19);
      }
      if (results_abi_cxx11_.
          super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ._M_impl._M_node._M_size != (long)local_680 - (long)local_688 >> 5) {
        do {
          local_8e0 = (undefined1  [8])0x0;
          local_8d8._M_data = (mutex **)0x1dcd6500;
          do {
            iVar9 = nanosleep((timespec *)local_8e0,(timespec *)local_8e0);
            if (iVar9 != -1) break;
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
        } while (results_abi_cxx11_.
                 super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ._M_impl._M_node._M_size != (long)local_680 - (long)local_688 >> 5);
      }
      local_8e0 = (undefined1  [8])res_lock;
      local_8d8._M_data = local_8d8._M_data & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_8e0);
      local_8d8._M_data._0_1_ = 1;
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"decode");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"output");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_e88,pvVar11);
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"zip");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"most_common_only");
      local_1038._0_8_ = local_1038._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar11,(boolean_t *)local_1038);
      uVar3 = local_1038[0];
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"zip");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"decodable_only");
      local_1038._0_8_ = local_1038._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar11,(boolean_t *)local_1038);
      write_to_zip(&local_e88,true,(bool)uVar3,(bool)local_1038[0],&results_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e88._M_dataplus._M_p != &local_e88.field_2) {
        operator_delete(local_e88._M_dataplus._M_p,local_e88.field_2._M_allocated_capacity + 1);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_8e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_fd8);
      absl::synchronization_internal::ThreadPool::~ThreadPool((ThreadPool *)local_b20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_688);
      Zippy::ZipArchive::~ZipArchive((ZipArchive *)local_d88);
    }
    else {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_1050,"general");
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"as_fasta");
      local_d88._0_8_ = local_d88._0_8_ & 0xffffffffffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar11,(boolean_t *)local_d88);
      if ((bool)local_d88[0] == true) {
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"input");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_d88,pvVar11);
        parseFasta((unordered_set<std::string> *)local_8e0,(string *)local_d88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d88._0_8_ != &local_d78) {
          operator_delete((void *)local_d88._0_8_,local_d78._M_allocated_capacity + 1);
        }
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"general");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"threads");
        local_b20._0_8_ = local_b20._0_8_ & 0xffffffff00000000;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                  (pvVar11,(int *)local_b20);
        absl::synchronization_internal::ThreadPool::ThreadPool
                  ((ThreadPool *)local_d88,local_b20._0_4_);
        plVar4 = local_8d0[0];
        if (local_8d0[1] ==
            (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)0x0) {
          pcVar24 = (char *)0x0;
          rVar18._M_data =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d0[0];
        }
        else {
          p_Var17 = *(_List_node_base **)local_8d0[0];
          rVar13._M_data = local_8d8._M_data;
          pfVar16 = (_Elt_pointer)local_8d0[0];
          while (p_Var17 == (_List_node_base *)0x0) {
            rVar13._M_data = rVar13._M_data + 0x20;
            p_Var2 = &pfVar16->super__Function_base;
            pfVar16 = (_Elt_pointer)((long)&(pfVar16->super__Function_base)._M_functor + 8);
            p_Var17 = *(_List_node_base **)((long)&p_Var2->_M_functor + 8);
          }
          uVar1 = 0;
          for (; ((ulong)p_Var17 & 1) == 0;
              p_Var17 = (_List_node_base *)((ulong)p_Var17 >> 1 | 0x8000000000000000)) {
            uVar1 = uVar1 + 1;
          }
          pcVar24 = (pfVar16->super__Function_base)._M_functor._M_pod_data + (uVar1 >> 3);
          rVar18._M_data =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)rVar13._M_data + (ulong)((uVar1 >> 3) << 5));
        }
        if (rVar18._M_data !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d0[0]) {
          do {
            local_b20._0_8_ = do_decode;
            local_b20._8_8_ = &res_lock;
            local_b10._M_dataplus._M_p = (pointer)&results_abi_cxx11_;
            local_b10._M_string_length = (size_type)(local_1050 + 0x14);
            local_b10.field_2._M_allocated_capacity = (size_type)local_1050;
            local_b10.field_2._8_8_ = &local_e10;
            local_af0._M_head_impl._M_data =
                 (reference_wrapper<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )&local_1b8;
            local_ae8._M_head_impl._M_data = (reference_wrapper<FreqTable>)&local_488;
            local_ae0._M_head_impl._M_data =
                 (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )rVar18._M_data;
            std::function<void()>::
            function<std::_Bind<void(*(std::reference_wrapper<std::__cxx11::string_const>,std::reference_wrapper<FreqTable>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<robin_hood::detail::Table<false,80ul,std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>>,std::reference_wrapper<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::reference_wrapper<int>,std::reference_wrapper<std::__cxx11::list<std::tuple<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std___td::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,std::mutex*)>,void>
                      ((function<void()> *)local_e50._M_pod_data,(_Bind<_195e0cfd_> *)local_b20);
            absl::synchronization_internal::ThreadPool::Schedule
                      ((ThreadPool *)local_d88,(function<void_()> *)&local_e50);
            if (local_e40 != (code *)0x0) {
              (*local_e40)(&local_e50,&local_e50,__destroy_functor);
            }
            pbVar19 = rVar18._M_data + 1;
            uVar22 = *(ulong *)(pcVar24 + 1);
            if (uVar22 == 0) {
              puVar6 = (ulong *)(pcVar24 + 9);
              do {
                puVar23 = puVar6;
                pbVar19 = pbVar19 + 8;
                uVar22 = *puVar23;
                puVar6 = puVar23 + 1;
              } while (uVar22 == 0);
            }
            else {
              puVar23 = (ulong *)(pcVar24 + 1);
            }
            uVar1 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              uVar1 = uVar1 + 1;
            }
            pcVar24 = (char *)((long)puVar23 + (ulong)(uVar1 >> 3));
            rVar18._M_data =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((((_Function_base *)&pbVar19->_M_dataplus)->_M_functor)._M_pod_data +
                 ((uVar1 >> 3) << 5));
          } while (rVar18._M_data !=
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar4);
        }
        if (results_abi_cxx11_.
            super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ._M_impl._M_node._M_size < local_8d0[1]) {
          do {
            local_b20._0_8_ = (pointer)0x1;
            local_b20._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            do {
              iVar9 = nanosleep((timespec *)local_b20,(timespec *)local_b20);
              if (iVar9 != -1) break;
              piVar12 = __errno_location();
            } while (*piVar12 == 4);
          } while (results_abi_cxx11_.
                   super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl._M_node._M_size < local_8d0[1]);
        }
        local_b20._0_8_ = res_lock;
        local_b20._8_8_ = local_b20._8_8_ & 0xffffffffffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b20);
        local_b20[8] = 1;
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"output");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_ea8,pvVar11);
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"general");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"zip");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"most_common_only");
        local_688 = (undefined1  [8])((ulong)local_688 & 0xffffffffffffff00);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar11,(boolean_t *)local_688);
        most_common_only = local_688[0];
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"general");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"zip");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"decodable_only");
        local_688 = (undefined1  [8])((ulong)local_688 & 0xffffffffffffff00);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar11,(boolean_t *)local_688);
        write_to_zip(&local_ea8,true,(bool)most_common_only,(bool)local_688[0],&results_abi_cxx11_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
          operator_delete(local_ea8._M_dataplus._M_p,local_ea8.field_2._M_allocated_capacity + 1);
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b20);
        absl::synchronization_internal::ThreadPool::~ThreadPool((ThreadPool *)local_d88);
        robin_hood::detail::
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_8e0);
      }
      else {
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"input");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_d88,pvVar11);
        std::ifstream::ifstream(local_b20,(string *)local_d88,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d88._0_8_ != &local_d78) {
          operator_delete((void *)local_d88._0_8_,local_d78._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_688);
        std::ostream::operator<<(local_678,(streambuf *)&local_b10);
        std::__cxx11::stringbuf::str();
        if ((char)in_FS_OFFSET[-2] == '\0') {
          local_f68._M_dataplus._M_p = (pointer)&local_f68.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f68,local_fd8,
                     (code *)((long)&(pbStack_fd0->_M_dataplus)._M_p +
                             (long)&((_Alloc_hider *)local_fd8)->_M_p));
          ECdecoding::ECdecoding
                    ((ECdecoding *)(*in_FS_OFFSET + -0x238),&local_f68,&local_488,&local_1b8,true,
                     (json *)local_1050);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f68._M_dataplus._M_p != &local_f68.field_2) {
            operator_delete(local_f68._M_dataplus._M_p,local_f68.field_2._M_allocated_capacity + 1);
          }
          __cxa_thread_atexit(ECdecoding::~ECdecoding,*in_FS_OFFSET + -0x238,&__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -2) = 1;
        }
        ECdecoding::decode((SeqEntry *)local_d88,(ECdecoding *)(*in_FS_OFFSET + -0x238),
                           local_1050._20_4_,&local_e10,(json *)local_1050);
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_1050,"decode");
        pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"output");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_1038,pvVar11);
        std::ofstream::ofstream(local_8e0,(string *)local_1038,_S_out|_S_bin);
        pcVar24 = local_1038 + 0x10;
        if ((char *)local_1038._0_8_ != pcVar24) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        uVar22 = (long)local_cc8 - (long)local_cd0;
        if (uVar22 == 0) {
          __dest = (void *)0x0;
        }
        else {
          if ((long)uVar22 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = operator_new(uVar22);
        }
        __n = (long)local_cc8 - (long)local_cd0;
        if (__n != 0) {
          memmove(__dest,local_cd0,__n);
        }
        local_1038._0_8_ = pcVar24;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1038,__dest,__n + (long)__dest);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_8e0,(char *)local_1038._0_8_,
                   CONCAT44(local_1038._12_4_,local_1038._8_4_));
        std::ostream::flush();
        std::ofstream::close();
        if ((char *)local_1038._0_8_ != pcVar24) {
          operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
        }
        if (__dest != (void *)0x0) {
          operator_delete(__dest,uVar22);
        }
        local_8e0 = (undefined1  [8])_VTT;
        *(undefined8 *)(local_8e0 + *(long *)&_VTT[-1].__data.__kind) = _strtod;
        std::filebuf::~filebuf((filebuf *)&local_8d8);
        std::ios_base::~ios_base(local_7e8);
        SeqEntry::~SeqEntry((SeqEntry *)local_d88);
        if (local_fd8 != (undefined1  [8])local_fc8) {
          operator_delete((void *)local_fd8,(ulong)(local_fc8._0_8_ + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_688);
        std::ios_base::~ios_base(local_608);
        std::ifstream::~ifstream(local_b20);
      }
    }
    robin_hood::detail::
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~Table(&local_1b8);
  }
  if (local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.frequencies.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.cumulative.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.super_ProbabilityEval.seq._M_dataplus._M_p !=
      &local_488.super_ProbabilityEval.seq.field_2) {
    operator_delete(local_488.super_ProbabilityEval.seq._M_dataplus._M_p,
                    local_488.super_ProbabilityEval.seq.field_2._M_allocated_capacity + 1);
  }
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_488.super_ProbabilityEval.motif);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_488.super_ProbabilityEval.updatedDict);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_200);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&local_6c0);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_288.motif);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&local_288.codewords);
  robin_hood::detail::
  Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table(&local_e10);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::destroy(&local_918);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_1050);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
    operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
  }
  argparse::ArgumentParser::~ArgumentParser(&local_370);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    res_lock = new std::mutex();
    argparse::ArgumentParser program("arithmetic_error_correction", "1.0.0");
    program.add_argument("-e", "--encode").default_value(false).implicit_value(true).help("encode a file");
    program.add_argument("-d", "--decode").default_value(false).implicit_value(true).help("decode a file");
    program.add_argument("Config").required().help("config file with program parameters");
    try {
        program.parse_args(argc, argv);
    }
    catch (const runtime_error &err) {
        cerr << err.what() << endl;
        cerr << program << endl;
        exit(EXIT_FAILURE);
    }
    // ensure only en- OR decoding is selected
    bool encode = program.get<bool>("--encode");
    bool decode = program.get<bool>("--decode");
    if (!(encode ^ decode) || program.get<bool>("-h")) {
        cerr << program << endl;
        exit(EXIT_FAILURE);
    }

    string configPath = program.get<string>("Config");
    nlohmann::json config = parseValidateConfig(configPath, encode);
    
    robin_hood::unordered_set<string> codewords = parseFasta(config["general"]["codebook"]["words"]); //hp4_gc40-60.fasta
    robin_hood::unordered_map<string, vector<string>> motif = readConcScheme(config["general"]["codebook"]["motifs"]); //hp4_gc40-60.json"
    
    int codewordLen = getCodewordLen(codewords);
    auto propMap = ProbMap(codewordLen, false, codewords, motif);
    robin_hood::unordered_map<string, int32_t> freqDict = propMap.freqDict();
    robin_hood::unordered_map<string, char2double> pMap = propMap.createTransitionDict(freqDict);
    results = list<tuple<string, vector<unsigned char>>>();
    FreqTable freqs = FreqTable(motif, "", 0, false, codewordLen, pMap);
    freqs.calcFreqs();
    if (encode) {
        if (static_cast<string>(config["encode"]["input"]).ends_with(".zip")) {
            encode_zip(config, freqs, config["encode"]["min_length"], config["encode"]["same_length"], configPath);
        } else {
            ifstream inStream(config["encode"]["input"], ios::binary);
            assert(inStream.good());
            BitInStream bin(inStream, config["general"]["sync"]);
            ofstream out(config["encode"]["output"], ios::binary);
            inflating(freqs, bin, out, config["encode"]["min_length"]);
            if(config["encode"]["update_config"]){
                out.flush();
                out.close();
                ifstream outin(config["encode"]["output"]);
                stringstream buffer;
                buffer << outin.rdbuf();
                string inp = buffer.str();
                int size = inp.size();
                config[nlohmann::json::json_pointer("/decode/length")] = size;
                std::ofstream confout(configPath);
                confout << config;
            }
        }
    } else {
        robin_hood::unordered_map<string, char2double> tMap = ProbMap(codewordLen, true, codewords,
                                                                motif).createTransitionDict(freqDict);
        if (static_cast<string>(config["decode"]["input"]).ends_with(".zip")) {
            Zippy::ZipArchive inarch(static_cast<string>(config["decode"]["input"]));
            std::vector<std::string> ents = inarch.GetEntryNames();
            absl::synchronization_internal::ThreadPool pool(config["general"]["threads"]);
            std::vector<std::string> inpts;
            for (auto &ent: ents) {
                inpts.push_back(inarch.GetEntry(ent).GetDataAsString());
            }
            for (auto &inp: inpts) {
                pool.Schedule(std::bind(do_decode, std::ref(inp), std::ref(freqs), std::ref(tMap), std::ref(motif), std::ref(config), std::ref(codewordLen), std::ref(results), std::ref(res_lock)));
            }
            while (results.size() != ents.size()) {
                this_thread::sleep_for(chrono::milliseconds(500));
            }
            {
                std::unique_lock<std::mutex> uLock(*res_lock);
                write_to_zip(config["decode"]["output"], true, static_cast<bool>(config["general"]["zip"]["most_common_only"]), static_cast<bool>(config["general"]["zip"]["decodable_only"]),results);
            }
        } else if (config["general"]["as_fasta"]) {
            // since we are returning a set, we wont have duplicates
            robin_hood::unordered_set<string> dna_lines = parseFasta(config["decode"]["input"]);
            absl::synchronization_internal::ThreadPool pool(config["general"]["threads"]);
            for (const string &line: dna_lines) {
                pool.Schedule(std::bind(do_decode, std::ref(line), std::ref(freqs), std::ref(tMap), std::ref(motif), std::ref(config), std::ref(codewordLen), std::ref(results), std::ref(res_lock)));
            }
            //TODO THIS CONDITION SHOULD BE IMPROVED (right now we can not make "results" a set and thus might have duplicates)
            // ideally we would not want any (semi) busy waiting and instead be notified when the threadpool is done
            while (results.size() < dna_lines.size()) {
                this_thread::sleep_for(chrono::milliseconds(1000));
            }
            {
                std::unique_lock<std::mutex> uLock(*res_lock);
                write_to_zip(config["decode"]["output"], true, static_cast<bool>(config["general"]["zip"]["most_common_only"]), static_cast<bool>(config["general"]["zip"]["decodable_only"]),results);
            }
        } else {
            ifstream iStream(config["decode"]["input"]);
            stringstream buffer;
            buffer << iStream.rdbuf();
            string inp = buffer.str();
            thread_local ECdecoding ecDec = ECdecoding(inp, freqs, tMap, true, config);

            SeqEntry dec = ecDec.decode(codewordLen, motif, config);
            ofstream out(config["decode"]["output"], ios::out | ios::binary);
            const vector<unsigned char> str = *dec.ac.bitout.get_data();
            std::string seq(reinterpret_cast<const char *>(str.data()), str.size());
            out << seq;
            out.flush();
            out.close();
        }
    }
}